

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int AdjustTree(Rtree *pRtree,RtreeNode *pNode,RtreeCell *pCell)

{
  int iVar1;
  RtreeCell *in_RDX;
  long *in_RSI;
  Rtree *in_RDI;
  int iCell;
  RtreeCell cell;
  RtreeNode *pParent;
  RtreeNode *p;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  RtreeCell *in_stack_ffffffffffffffa0;
  Rtree *in_stack_ffffffffffffffa8;
  RtreeCoord in_stack_ffffffffffffffb0;
  RtreeCoord in_stack_ffffffffffffffb4;
  RtreeNode *in_stack_ffffffffffffffb8;
  Rtree *in_stack_ffffffffffffffc0;
  long *local_28;
  
  local_28 = in_RSI;
  while( true ) {
    if (*local_28 == 0) {
      return 0;
    }
    local_28 = (long *)*local_28;
    iVar1 = nodeParentIndex(in_stack_ffffffffffffffa8,(RtreeNode *)in_stack_ffffffffffffffa0,
                            (int *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    if (iVar1 != 0) break;
    nodeGetCell(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4.i,
                (RtreeCell *)in_stack_ffffffffffffffa8);
    iVar1 = cellContains(in_RDI,(RtreeCell *)&stack0xffffffffffffffa0,in_RDX);
    if (iVar1 == 0) {
      cellUnion(in_RDI,(RtreeCell *)&stack0xffffffffffffffa0,in_RDX);
      nodeOverwriteCell((Rtree *)CONCAT44(in_stack_ffffffffffffffb4.i,in_stack_ffffffffffffffb0.i),
                        (RtreeNode *)in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                        in_stack_ffffffffffffff9c);
    }
  }
  return 0x10b;
}

Assistant:

static int AdjustTree(
  Rtree *pRtree,                    /* Rtree table */
  RtreeNode *pNode,                 /* Adjust ancestry of this node. */
  RtreeCell *pCell                  /* This cell was just inserted */
){
  RtreeNode *p = pNode;
  while( p->pParent ){
    RtreeNode *pParent = p->pParent;
    RtreeCell cell;
    int iCell;

    if( nodeParentIndex(pRtree, p, &iCell) ){
      return SQLITE_CORRUPT_VTAB;
    }

    nodeGetCell(pRtree, pParent, iCell, &cell);
    if( !cellContains(pRtree, &cell, pCell) ){
      cellUnion(pRtree, &cell, pCell);
      nodeOverwriteCell(pRtree, pParent, &cell, iCell);
    }
 
    p = pParent;
  }
  return SQLITE_OK;
}